

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_loader.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::IrLoader::AddInstruction(IrLoader *this,spv_parsed_instruction_t *inst)

{
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *dbg_line;
  ushort uVar1;
  uint uVar2;
  uint32_t *puVar3;
  pointer pIVar4;
  char *source;
  Function *pFVar5;
  tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> tVar6;
  pointer puVar7;
  size_t sVar8;
  bool bVar9;
  OpenCLDebugInfo100Instructions ext_inst_key;
  uint32_t uVar10;
  Module *pMVar11;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> this_00;
  Instruction *pIVar12;
  ulong uVar13;
  char *pcVar14;
  BasicBlock *pBVar15;
  long lVar16;
  Instruction *pIVar17;
  MessageConsumer *pMVar18;
  Op OVar19;
  Op opcode_00;
  Op opcode;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_88;
  spv_position_t local_80;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_68;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_60;
  spv_position_t local_58;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_40;
  _Head_base<0UL,_spvtools::opt::Function_*,_false> local_38;
  
  this->inst_index_ = this->inst_index_ + 1;
  bVar9 = IsLineInst(inst);
  if (bVar9) {
    pMVar11 = this->module_;
    pMVar11->contains_debug_info_ = true;
    pIVar17 = (this->last_line_inst_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    (this->last_line_inst_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = (Instruction *)0x0;
    if (pIVar17 != (Instruction *)0x0) {
      (**(code **)((long)(pIVar17->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                         _vptr_IntrusiveNodeBase + 8))();
      pMVar11 = this->module_;
    }
    local_80.line = (size_t)pMVar11->context_;
    std::vector<spvtools::opt::Instruction,std::allocator<spvtools::opt::Instruction>>::
    emplace_back<spvtools::opt::IRContext*,spv_parsed_instruction_t_const&,spvtools::opt::DebugScope&>
              ((vector<spvtools::opt::Instruction,std::allocator<spvtools::opt::Instruction>> *)
               &this->dbg_line_info_,(IRContext **)&local_80,inst,&this->last_dbg_scope_);
    return true;
  }
  uVar1 = inst->opcode;
  opcode = (Op)uVar1;
  bVar9 = spvIsExtendedInstruction(opcode);
  if ((bVar9) && (bVar9 = spvExtInstIsDebugInfo(inst->ext_inst_type), bVar9)) {
    puVar3 = inst->words;
    if (puVar3[4] == 0x18) {
      (this->last_dbg_scope_).lexical_scope_ = 0;
      (this->last_dbg_scope_).inlined_at_ = 0;
LAB_00207eeb:
      this->module_->contains_debug_info_ = true;
      return true;
    }
    if (puVar3[4] == 0x17) {
      if (inst->num_words < 7) {
        uVar13 = 0;
      }
      else {
        uVar13 = (ulong)puVar3[6] << 0x20;
      }
      this->last_dbg_scope_ = (DebugScope)(puVar3[5] | uVar13);
      goto LAB_00207eeb;
    }
  }
  this_00._M_head_impl = (Instruction *)operator_new(0x70);
  dbg_line = &this->dbg_line_info_;
  Instruction::Instruction(this_00._M_head_impl,this->module_->context_,inst,dbg_line);
  pIVar4 = ((this_00._M_head_impl)->dbg_line_insts_).
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_88._M_head_impl = this_00._M_head_impl;
  if (((this_00._M_head_impl)->dbg_line_insts_).
      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
      _M_impl.super__Vector_impl_data._M_start == pIVar4) {
    pIVar17 = (this->last_line_inst_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar17 != (Instruction *)0x0) {
      Instruction::SetDebugScope(pIVar17,&this->last_dbg_scope_);
      std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
      push_back(&(this_00._M_head_impl)->dbg_line_insts_,
                (this->last_line_inst_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl);
      pIVar12 = Instruction::Clone(((this_00._M_head_impl)->dbg_line_insts_).
                                   super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -1,
                                   this->module_->context_);
      pIVar17 = (this->last_line_inst_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      (this->last_line_inst_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = pIVar12;
      if (pIVar17 != (Instruction *)0x0) {
        (**(code **)((long)(pIVar17->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                           _vptr_IntrusiveNodeBase + 8))();
        pIVar12 = (this->last_line_inst_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      }
      bVar9 = Instruction::IsDebugLineInst(pIVar12);
      if (bVar9) {
        pIVar17 = (this->last_line_inst_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar10 = IRContext::TakeNextId(this->module_->context_);
        Instruction::SetResultId(pIVar17,uVar10);
      }
    }
  }
  else {
    if ((this->extra_line_tracking_ == true) && (bVar9 = Instruction::IsNoLine(pIVar4 + -1), !bVar9)
       ) {
      pIVar12 = Instruction::Clone(((this_00._M_head_impl)->dbg_line_insts_).
                                   super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -1,
                                   this->module_->context_);
      pIVar17 = (this->last_line_inst_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      (this->last_line_inst_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = pIVar12;
      if (pIVar17 != (Instruction *)0x0) {
        (**(code **)((long)(pIVar17->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                           _vptr_IntrusiveNodeBase + 8))();
        pIVar12 = (this->last_line_inst_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      }
      bVar9 = Instruction::IsDebugLineInst(pIVar12);
      if (bVar9) {
        pIVar17 = (this->last_line_inst_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        uVar10 = IRContext::TakeNextId(this->module_->context_);
        Instruction::SetResultId(pIVar17,uVar10);
      }
    }
    std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::clear
              (dbg_line);
  }
  source = (this->source_)._M_dataplus._M_p;
  local_80.line = (size_t)this->inst_index_;
  local_80.column = 0;
  local_80.index = 0;
  OVar19 = (Op)uVar1;
  if (OVar19 == OpLabel) {
    if ((this->function_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
        .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl == (Function *)0x0) {
      pMVar18 = this->consumer_;
      pcVar14 = "OpLabel outside function";
    }
    else {
      if ((this->block_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl ==
          (BasicBlock *)0x0) {
        MakeUnique<spvtools::opt::BasicBlock,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
                  ((spvtools *)&local_58,
                   (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    *)&local_88);
        sVar8 = local_58.line;
        local_58.line = 0;
        std::
        __uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ::reset((__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)&this->block_,(pointer)sVar8);
        std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ::~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       *)&local_58);
        goto LAB_00207ed8;
      }
      pMVar18 = this->consumer_;
      pcVar14 = "OpLabel inside basic block";
    }
LAB_00207fc1:
    Error(pMVar18,source,&local_80,pcVar14);
    goto LAB_00207fce;
  }
  if (OVar19 == OpFunctionEnd) {
    pFVar5 = (this->function_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
             .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
    if (pFVar5 == (Function *)0x0) {
      pMVar18 = this->consumer_;
      pcVar14 = "OpFunctionEnd without corresponding OpFunction";
    }
    else {
      if ((this->block_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl ==
          (BasicBlock *)0x0) {
        local_88._M_head_impl = (Instruction *)0x0;
        tVar6.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               *)&(pFVar5->end_inst_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ;
        (pFVar5->end_inst_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             = (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                )this_00._M_head_impl;
        if (tVar6.
            super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
            .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
            (_Head_base<0UL,_spvtools::opt::Instruction_*,_false>)0x0) {
          (**(code **)(*(long *)tVar6.
                                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                _M_head_impl + 8))();
        }
        local_38._M_head_impl =
             (this->function_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
             .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
        pMVar11 = this->module_;
        (this->function_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
        .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl = (Function *)0x0;
        std::
        vector<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>,std::allocator<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>>
        ::
        emplace_back<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>
                  ((vector<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>,std::allocator<std::unique_ptr<spvtools::opt::Function,std::default_delete<spvtools::opt::Function>>>>
                    *)&pMVar11->functions_,
                   (unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                    *)&local_38);
        std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
        ~unique_ptr((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                     *)&local_38);
        std::__uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ::reset((__uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 *)&this->function_,(pointer)0x0);
        goto LAB_00207ed8;
      }
      pMVar18 = this->consumer_;
      pcVar14 = "OpFunctionEnd inside basic block";
    }
    goto LAB_00207fc1;
  }
  if (OVar19 == OpFunction) {
    if ((this->function_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
        .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl != (Function *)0x0) {
      pMVar18 = this->consumer_;
      pcVar14 = "function inside function";
      goto LAB_00207fc1;
    }
    MakeUnique<spvtools::opt::Function,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
              ((spvtools *)&local_58,
               (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                *)&local_88);
    sVar8 = local_58.line;
    local_58.line = 0;
    std::__uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
    reset((__uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_> *
          )&this->function_,(pointer)sVar8);
    std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 *)&local_58);
    goto LAB_00207ed8;
  }
  bVar9 = spvOpcodeIsBlockTerminator(OVar19);
  pFVar5 = (this->function_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
           .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
  if (bVar9) {
    if (pFVar5 == (Function *)0x0) {
      pMVar18 = this->consumer_;
      pcVar14 = "terminator instruction outside function";
    }
    else {
      pBVar15 = (this->block_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      if (pBVar15 != (BasicBlock *)0x0) {
        if ((this->last_dbg_scope_).lexical_scope_ != 0) {
          Instruction::SetDebugScope(this_00._M_head_impl,&this->last_dbg_scope_);
          pBVar15 = (this->block_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        }
        local_88._M_head_impl = (Instruction *)0x0;
        utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
                  ((IntrusiveNodeBase<spvtools::opt::Instruction> *)this_00._M_head_impl,
                   &(pBVar15->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_);
        pFVar5 = (this->function_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                 .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
        local_40._M_head_impl =
             (this->block_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        (this->block_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
        .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl = (BasicBlock *)0x0;
        Function::AddBasicBlock
                  (pFVar5,(unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                           *)&local_40);
        std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ::~unique_ptr((unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                       *)&local_40);
        std::
        __uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
        ::reset((__uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                 *)&this->block_,(pointer)0x0);
        pIVar17 = (this->last_line_inst_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        (this->last_line_inst_)._M_t.
        super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
        ._M_t.
        super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
             (Instruction *)0x0;
        (this->last_dbg_scope_).lexical_scope_ = 0;
        (this->last_dbg_scope_).inlined_at_ = 0;
        if (pIVar17 != (Instruction *)0x0) {
          (**(code **)((long)(pIVar17->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                             _vptr_IntrusiveNodeBase + 8))();
        }
        std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::clear
                  (dbg_line);
        goto LAB_00207ed8;
      }
      pMVar18 = this->consumer_;
      pcVar14 = "terminator instruction outside basic block";
    }
    goto LAB_00207fc1;
  }
  OVar19 = (Op)uVar1;
  opcode_00 = (Op)uVar1;
  if (pFVar5 != (Function *)0x0) {
    if ((OVar19 & ~OpUndef) == OpLoopMerge) {
      (this->last_dbg_scope_).lexical_scope_ = 0;
      (this->last_dbg_scope_).inlined_at_ = 0;
    }
    else if ((this->last_dbg_scope_).lexical_scope_ != 0) {
      Instruction::SetDebugScope(this_00._M_head_impl,&this->last_dbg_scope_);
    }
    bVar9 = spvIsExtendedInstruction(OVar19);
    if ((bVar9) && (bVar9 = spvExtInstIsDebugInfo(inst->ext_inst_type), bVar9)) {
      uVar2 = inst->words[4];
      if (inst->ext_inst_type == SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
        if (((0x1d < uVar2) || ((0x31800000U >> (uVar2 & 0x1f) & 1) == 0)) && (uVar2 != 0x65)) {
LAB_00208142:
          pMVar18 = this->consumer_;
          pcVar14 = 
          "Debug info extension instruction other than DebugScope, DebugNoScope, DebugDeclare, and DebugValue found inside function"
          ;
          goto LAB_0020814c;
        }
        pBVar15 = (this->block_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        if (pBVar15 == (BasicBlock *)0x0) {
          Errorf<spv::Op_const&>
                    (this->consumer_,source,&local_80,
                     "Debug info extension instruction found inside function but outside block",
                     &opcode);
          goto LAB_00207ed8;
        }
      }
      else {
        if (inst->ext_inst_type == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100) {
          if ((uVar2 != 0x1d) && (uVar2 != 0x1c)) {
            pMVar18 = this->consumer_;
            pcVar14 = 
            "Debug info extension instruction other than DebugScope, DebugNoScope, DebugFunctionDefinition, DebugDeclare, and DebugValue found inside function"
            ;
            goto LAB_0020814c;
          }
        }
        else if ((uVar2 != 0x1d) && (uVar2 != 0x1c)) goto LAB_00208142;
        pBVar15 = (this->block_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
        if (pBVar15 == (BasicBlock *)0x0) {
          pMVar11 = (Module *)
                    (this->function_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                    .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl;
          goto LAB_00208135;
        }
      }
LAB_00207fae:
      pIVar17 = &(pBVar15->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
      goto LAB_002081b3;
    }
    pBVar15 = (this->block_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
              .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
    if (pBVar15 != (BasicBlock *)0x0) goto LAB_00207fae;
    if (opcode_00 == OpFunctionParameter) {
      local_88._M_head_impl = (Instruction *)0x0;
      local_68._M_head_impl = this_00._M_head_impl;
      std::
      vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
      ::
      emplace_back<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
                ((vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
                  *)&((this->function_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                      .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl)->
                     params_,
                 (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                  *)&local_68);
      if (local_68._M_head_impl != (Instruction *)0x0) {
        (*((local_68._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
          _vptr_IntrusiveNodeBase[1])();
      }
      local_68._M_head_impl = (Instruction *)0x0;
      goto LAB_00207ed8;
    }
    pMVar18 = this->consumer_;
    pcVar14 = "Non-OpFunctionParameter (opcode: %d) found inside function but outside basic block";
    goto LAB_0020814c;
  }
  if ((this->block_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
      .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl != (BasicBlock *)0x0)
  {
    local_58.line = 0xb7;
    local_58.column = 0;
    local_58.index = 0;
    Log(this->consumer_,SPV_MSG_INTERNAL_ERROR,
        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/ir_loader.cpp"
        ,&local_58,"assertion failed: block_ == nullptr");
    exit(1);
  }
  switch(uVar1) {
  case 2:
  case 3:
  case 4:
  case 7:
    lVar16 = 0x290;
    break;
  case 5:
  case 6:
  case 8:
  case 9:
  case 0xc:
  case 0xd:
    goto switchD_00207f31_caseD_5;
  case 10:
    lVar16 = 0xa0;
    break;
  case 0xb:
    lVar16 = 0x118;
    break;
  case 0xe:
    pIVar17 = (this->module_->memory_model_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    (this->module_->memory_model_)._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = this_00._M_head_impl;
LAB_0020811d:
    local_88._M_head_impl = (Instruction *)0x0;
    if (pIVar17 == (Instruction *)0x0) {
      return true;
    }
    (*(pIVar17->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase[1])();
    goto LAB_00207ed8;
  case 0xf:
    lVar16 = 0x1a0;
    break;
  case 0x10:
switchD_00207f31_caseD_10:
    lVar16 = 0x218;
    break;
  case 0x11:
    pMVar11 = this->module_;
LAB_00208135:
    pIVar17 = &(pMVar11->capabilities_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    goto LAB_002081b3;
  default:
    if (OVar19 == OpExecutionModeId) goto switchD_00207f31_caseD_10;
    if (OVar19 == OpSamplerImageAddressingModeNV) {
      pIVar17 = (this->module_->sampled_image_address_mode_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      (this->module_->sampled_image_address_mode_)._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           this_00._M_head_impl;
      goto LAB_0020811d;
    }
switchD_00207f31_caseD_5:
    if (uVar1 - 5 < 2) {
      lVar16 = 0x308;
    }
    else if (OVar19 == OpModuleProcessed) {
      lVar16 = 0x380;
    }
    else {
      bVar9 = IsAnnotationInst(OVar19);
      if (bVar9) {
        lVar16 = 0x470;
      }
      else {
        bVar9 = IsTypeInst(opcode_00);
        if (((bVar9) || (bVar9 = IsConstantInst(opcode_00), bVar9)) ||
           ((opcode_00 == OpVariable || (opcode_00 == OpUndef)))) {
          lVar16 = 0x4e8;
        }
        else {
          bVar9 = spvIsExtendedInstruction(OVar19);
          if ((!bVar9) || (bVar9 = spvExtInstIsDebugInfo(inst->ext_inst_type), !bVar9)) {
            bVar9 = spvIsExtendedInstruction(OVar19);
            if ((!bVar9) || (bVar9 = spvExtInstIsNonSemantic(inst->ext_inst_type), !bVar9)) {
              pMVar18 = this->consumer_;
              pcVar14 = "Unhandled inst type (opcode: %d) found outside function definition.";
LAB_0020814c:
              Errorf<spv::Op_const&>(pMVar18,source,&local_80,pcVar14,&opcode);
LAB_00207fce:
              bVar9 = false;
LAB_00207fd0:
              if (local_88._M_head_impl != (Instruction *)0x0) {
                (*((local_88._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                  _vptr_IntrusiveNodeBase[1])();
                return bVar9;
              }
              return bVar9;
            }
            pMVar11 = this->module_;
            puVar7 = (pMVar11->functions_).
                     super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if ((pMVar11->functions_).
                super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != puVar7) {
              local_88._M_head_impl = (Instruction *)0x0;
              local_60._M_head_impl = this_00._M_head_impl;
              std::
              vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
              ::
              emplace_back<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
                        ((vector<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>,std::allocator<std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>>
                          *)&(puVar7[-1]._M_t.
                              super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_spvtools::opt::Function_*,_std::default_delete<spvtools::opt::Function>_>
                              .super__Head_base<0UL,_spvtools::opt::Function_*,_false>._M_head_impl)
                             ->non_semantic_,
                         (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          *)&local_60);
              if (local_60._M_head_impl != (Instruction *)0x0) {
                (*((local_60._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                  _vptr_IntrusiveNodeBase[1])();
              }
              local_60._M_head_impl = (Instruction *)0x0;
LAB_00207ed8:
              bVar9 = true;
              goto LAB_00207fd0;
            }
            pIVar17 = &(pMVar11->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.
                       sentinel_;
            goto LAB_002081b3;
          }
          lVar16 = 0x3f8;
        }
      }
    }
  }
  pIVar17 = (Instruction *)((long)&(this->module_->header_).magic_number + lVar16);
LAB_002081b3:
  utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
            ((IntrusiveNodeBase<spvtools::opt::Instruction> *)this_00._M_head_impl,pIVar17);
  return true;
}

Assistant:

bool IrLoader::AddInstruction(const spv_parsed_instruction_t* inst) {
  ++inst_index_;
  if (IsLineInst(inst)) {
    module()->SetContainsDebugInfo();
    last_line_inst_.reset();
    dbg_line_info_.emplace_back(module()->context(), *inst, last_dbg_scope_);
    return true;
  }

  // If it is a DebugScope or DebugNoScope of debug extension, we do not
  // create a new instruction, but simply keep the information in
  // struct DebugScope.
  const auto opcode = static_cast<spv::Op>(inst->opcode);
  if (spvIsExtendedInstruction(opcode) &&
      spvExtInstIsDebugInfo(inst->ext_inst_type)) {
    const uint32_t ext_inst_index = inst->words[kExtInstSetIndex];
    if (inst->ext_inst_type == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100 ||
        inst->ext_inst_type ==
            SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
      const CommonDebugInfoInstructions ext_inst_key =
          CommonDebugInfoInstructions(ext_inst_index);
      if (ext_inst_key == CommonDebugInfoDebugScope) {
        uint32_t inlined_at = 0;
        if (inst->num_words > kInlinedAtIndex)
          inlined_at = inst->words[kInlinedAtIndex];
        last_dbg_scope_ =
            DebugScope(inst->words[kLexicalScopeIndex], inlined_at);
        module()->SetContainsDebugInfo();
        return true;
      }
      if (ext_inst_key == CommonDebugInfoDebugNoScope) {
        last_dbg_scope_ = DebugScope(kNoDebugScope, kNoInlinedAt);
        module()->SetContainsDebugInfo();
        return true;
      }
    } else {
      const DebugInfoInstructions ext_inst_key =
          DebugInfoInstructions(ext_inst_index);
      if (ext_inst_key == DebugInfoDebugScope) {
        uint32_t inlined_at = 0;
        if (inst->num_words > kInlinedAtIndex)
          inlined_at = inst->words[kInlinedAtIndex];
        last_dbg_scope_ =
            DebugScope(inst->words[kLexicalScopeIndex], inlined_at);
        module()->SetContainsDebugInfo();
        return true;
      }
      if (ext_inst_key == DebugInfoDebugNoScope) {
        last_dbg_scope_ = DebugScope(kNoDebugScope, kNoInlinedAt);
        module()->SetContainsDebugInfo();
        return true;
      }
    }
  }

  std::unique_ptr<Instruction> spv_inst(
      new Instruction(module()->context(), *inst, std::move(dbg_line_info_)));
  if (!spv_inst->dbg_line_insts().empty()) {
    if (extra_line_tracking_ &&
        (!spv_inst->dbg_line_insts().back().IsNoLine())) {
      last_line_inst_ = std::unique_ptr<Instruction>(
          spv_inst->dbg_line_insts().back().Clone(module()->context()));
      if (last_line_inst_->IsDebugLineInst())
        last_line_inst_->SetResultId(module()->context()->TakeNextId());
    }
    dbg_line_info_.clear();
  } else if (last_line_inst_ != nullptr) {
    last_line_inst_->SetDebugScope(last_dbg_scope_);
    spv_inst->dbg_line_insts().push_back(*last_line_inst_);
    last_line_inst_ = std::unique_ptr<Instruction>(
        spv_inst->dbg_line_insts().back().Clone(module()->context()));
    if (last_line_inst_->IsDebugLineInst())
      last_line_inst_->SetResultId(module()->context()->TakeNextId());
  }

  const char* src = source_.c_str();
  spv_position_t loc = {inst_index_, 0, 0};

  // Handle function and basic block boundaries first, then normal
  // instructions.
  if (opcode == spv::Op::OpFunction) {
    if (function_ != nullptr) {
      Error(consumer_, src, loc, "function inside function");
      return false;
    }
    function_ = MakeUnique<Function>(std::move(spv_inst));
  } else if (opcode == spv::Op::OpFunctionEnd) {
    if (function_ == nullptr) {
      Error(consumer_, src, loc,
            "OpFunctionEnd without corresponding OpFunction");
      return false;
    }
    if (block_ != nullptr) {
      Error(consumer_, src, loc, "OpFunctionEnd inside basic block");
      return false;
    }
    function_->SetFunctionEnd(std::move(spv_inst));
    module_->AddFunction(std::move(function_));
    function_ = nullptr;
  } else if (opcode == spv::Op::OpLabel) {
    if (function_ == nullptr) {
      Error(consumer_, src, loc, "OpLabel outside function");
      return false;
    }
    if (block_ != nullptr) {
      Error(consumer_, src, loc, "OpLabel inside basic block");
      return false;
    }
    block_ = MakeUnique<BasicBlock>(std::move(spv_inst));
  } else if (spvOpcodeIsBlockTerminator(opcode)) {
    if (function_ == nullptr) {
      Error(consumer_, src, loc, "terminator instruction outside function");
      return false;
    }
    if (block_ == nullptr) {
      Error(consumer_, src, loc, "terminator instruction outside basic block");
      return false;
    }
    if (last_dbg_scope_.GetLexicalScope() != kNoDebugScope)
      spv_inst->SetDebugScope(last_dbg_scope_);
    block_->AddInstruction(std::move(spv_inst));
    function_->AddBasicBlock(std::move(block_));
    block_ = nullptr;
    last_dbg_scope_ = DebugScope(kNoDebugScope, kNoInlinedAt);
    last_line_inst_.reset();
    dbg_line_info_.clear();
  } else {
    if (function_ == nullptr) {  // Outside function definition
      SPIRV_ASSERT(consumer_, block_ == nullptr);
      if (opcode == spv::Op::OpCapability) {
        module_->AddCapability(std::move(spv_inst));
      } else if (opcode == spv::Op::OpExtension) {
        module_->AddExtension(std::move(spv_inst));
      } else if (opcode == spv::Op::OpExtInstImport) {
        module_->AddExtInstImport(std::move(spv_inst));
      } else if (opcode == spv::Op::OpMemoryModel) {
        module_->SetMemoryModel(std::move(spv_inst));
      } else if (opcode == spv::Op::OpSamplerImageAddressingModeNV) {
        module_->SetSampledImageAddressMode(std::move(spv_inst));
      } else if (opcode == spv::Op::OpEntryPoint) {
        module_->AddEntryPoint(std::move(spv_inst));
      } else if (opcode == spv::Op::OpExecutionMode ||
                 opcode == spv::Op::OpExecutionModeId) {
        module_->AddExecutionMode(std::move(spv_inst));
      } else if (IsDebug1Inst(opcode)) {
        module_->AddDebug1Inst(std::move(spv_inst));
      } else if (IsDebug2Inst(opcode)) {
        module_->AddDebug2Inst(std::move(spv_inst));
      } else if (IsDebug3Inst(opcode)) {
        module_->AddDebug3Inst(std::move(spv_inst));
      } else if (IsAnnotationInst(opcode)) {
        module_->AddAnnotationInst(std::move(spv_inst));
      } else if (IsTypeInst(opcode)) {
        module_->AddType(std::move(spv_inst));
      } else if (IsConstantInst(opcode) || opcode == spv::Op::OpVariable ||
                 opcode == spv::Op::OpUndef) {
        module_->AddGlobalValue(std::move(spv_inst));
      } else if (spvIsExtendedInstruction(opcode) &&
                 spvExtInstIsDebugInfo(inst->ext_inst_type)) {
        module_->AddExtInstDebugInfo(std::move(spv_inst));
      } else if (spvIsExtendedInstruction(opcode) &&
                 spvExtInstIsNonSemantic(inst->ext_inst_type)) {
        // If there are no functions, add the non-semantic instructions to the
        // global values. Otherwise append it to the list of the last function.
        auto func_begin = module_->begin();
        auto func_end = module_->end();
        if (func_begin == func_end) {
          module_->AddGlobalValue(std::move(spv_inst));
        } else {
          (--func_end)->AddNonSemanticInstruction(std::move(spv_inst));
        }
      } else {
        Errorf(consumer_, src, loc,
               "Unhandled inst type (opcode: %d) found outside function "
               "definition.",
               opcode);
        return false;
      }
    } else {
      if (opcode == spv::Op::OpLoopMerge || opcode == spv::Op::OpSelectionMerge)
        last_dbg_scope_ = DebugScope(kNoDebugScope, kNoInlinedAt);
      if (last_dbg_scope_.GetLexicalScope() != kNoDebugScope)
        spv_inst->SetDebugScope(last_dbg_scope_);
      if (spvIsExtendedInstruction(opcode) &&
          spvExtInstIsDebugInfo(inst->ext_inst_type)) {
        const uint32_t ext_inst_index = inst->words[kExtInstSetIndex];
        if (inst->ext_inst_type == SPV_EXT_INST_TYPE_OPENCL_DEBUGINFO_100) {
          const OpenCLDebugInfo100Instructions ext_inst_key =
              OpenCLDebugInfo100Instructions(ext_inst_index);
          switch (ext_inst_key) {
            case OpenCLDebugInfo100DebugDeclare: {
              if (block_ == nullptr)  // Inside function but outside blocks
                function_->AddDebugInstructionInHeader(std::move(spv_inst));
              else
                block_->AddInstruction(std::move(spv_inst));
              break;
            }
            case OpenCLDebugInfo100DebugValue: {
              if (block_ == nullptr)  // Inside function but outside blocks
                function_->AddDebugInstructionInHeader(std::move(spv_inst));
              else
                block_->AddInstruction(std::move(spv_inst));
              break;
            }
            default: {
              Errorf(consumer_, src, loc,
                     "Debug info extension instruction other than DebugScope, "
                     "DebugNoScope, DebugFunctionDefinition, DebugDeclare, and "
                     "DebugValue found inside function",
                     opcode);
              return false;
            }
          }
        } else if (inst->ext_inst_type ==
                   SPV_EXT_INST_TYPE_NONSEMANTIC_SHADER_DEBUGINFO_100) {
          const NonSemanticShaderDebugInfo100Instructions ext_inst_key =
              NonSemanticShaderDebugInfo100Instructions(ext_inst_index);
          switch (ext_inst_key) {
            case NonSemanticShaderDebugInfo100DebugDeclare:
            case NonSemanticShaderDebugInfo100DebugValue:
            case NonSemanticShaderDebugInfo100DebugScope:
            case NonSemanticShaderDebugInfo100DebugNoScope:
            case NonSemanticShaderDebugInfo100DebugFunctionDefinition: {
              if (block_ == nullptr) {  // Inside function but outside blocks
                Errorf(consumer_, src, loc,
                       "Debug info extension instruction found inside function "
                       "but outside block",
                       opcode);
              } else {
                block_->AddInstruction(std::move(spv_inst));
              }
              break;
            }
            default: {
              Errorf(consumer_, src, loc,
                     "Debug info extension instruction other than DebugScope, "
                     "DebugNoScope, DebugDeclare, and DebugValue found inside "
                     "function",
                     opcode);
              return false;
            }
          }
        } else {
          const DebugInfoInstructions ext_inst_key =
              DebugInfoInstructions(ext_inst_index);
          switch (ext_inst_key) {
            case DebugInfoDebugDeclare: {
              if (block_ == nullptr)  // Inside function but outside blocks
                function_->AddDebugInstructionInHeader(std::move(spv_inst));
              else
                block_->AddInstruction(std::move(spv_inst));
              break;
            }
            case DebugInfoDebugValue: {
              if (block_ == nullptr)  // Inside function but outside blocks
                function_->AddDebugInstructionInHeader(std::move(spv_inst));
              else
                block_->AddInstruction(std::move(spv_inst));
              break;
            }
            default: {
              Errorf(consumer_, src, loc,
                     "Debug info extension instruction other than DebugScope, "
                     "DebugNoScope, DebugDeclare, and DebugValue found inside "
                     "function",
                     opcode);
              return false;
            }
          }
        }
      } else {
        if (block_ == nullptr) {  // Inside function but outside blocks
          if (opcode != spv::Op::OpFunctionParameter) {
            Errorf(consumer_, src, loc,
                   "Non-OpFunctionParameter (opcode: %d) found inside "
                   "function but outside basic block",
                   opcode);
            return false;
          }
          function_->AddParameter(std::move(spv_inst));
        } else {
          block_->AddInstruction(std::move(spv_inst));
        }
      }
    }
  }
  return true;
}